

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O1

void wasm::makeClampLimitLiterals<unsigned_int,float>(Literal *iMin,Literal *fMin,Literal *fMax)

{
  anon_union_16_6_1532cd5a_for_Literal_0 local_38;
  undefined8 local_28;
  
  local_38.i32 = 0;
  local_28 = 2;
  Literal::operator=(iMin,(Literal *)&local_38.func);
  Literal::~Literal((Literal *)&local_38.func);
  local_38.i32 = -0x40800000;
  local_28 = 4;
  Literal::operator=(fMin,(Literal *)&local_38.func);
  Literal::~Literal((Literal *)&local_38.func);
  local_38.i32 = 0x4f800000;
  local_28 = 4;
  Literal::operator=(fMax,(Literal *)&local_38.func);
  Literal::~Literal((Literal *)&local_38.func);
  return;
}

Assistant:

void makeClampLimitLiterals(Literal& iMin, Literal& fMin, Literal& fMax) {
  IntType minVal = std::numeric_limits<IntType>::min();
  IntType maxVal = std::numeric_limits<IntType>::max();
  iMin = Literal(minVal);
  fMin = Literal(FloatType(minVal) - 1);
  fMax = Literal(FloatType(maxVal) + 1);
}